

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O3

void emit_fold(BuildCtx *ctx)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  dasm_State *pdVar11;
  int extraout_EDX;
  dasm_State *__s;
  uint uVar12;
  int *unaff_RBP;
  int in_ESI;
  uint uVar13;
  uint *puVar14;
  BuildCtx *pBVar15;
  uint uVar16;
  uint uVar17;
  uint32_t uVar18;
  ulong uVar19;
  bool bVar20;
  char buf [256];
  uint32_t htab [8193];
  char *pcStack_8198;
  int local_8138;
  short local_8134;
  char local_8132;
  char local_8131;
  undefined1 local_8130 [248];
  char *local_8038 [4097];
  
  pBVar15 = (BuildCtx *)*ctx->args;
  if (pBVar15 == (BuildCtx *)0x0) {
LAB_0010ad52:
    emit_fold_cold_6();
  }
  else {
    if ((*(char *)&pBVar15->D == '-') &&
       (__stream = _stdin, *(char *)((long)&pBVar15->D + 1) == '\0')) {
LAB_0010a9f0:
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx->fp);
      fwrite("static const FoldFunc fold_func[] = {\n",0x26,1,(FILE *)ctx->fp);
      lineno = 0;
      funcidx = 0;
      nkeys = 0;
      pcVar7 = fgets((char *)&local_8138,0x100,__stream);
      pcVar8 = (char *)ctx;
      if (pcVar7 != (char *)0x0) {
        unaff_RBP = &local_8138;
        do {
          lineno = lineno + 1;
          if (local_8134 == 0x444c && local_8138 == 0x4f464a4c) {
            pcVar8 = strchr(&local_8132,0x29);
            if (pcVar8 == (char *)0x0 || local_8132 != '(') {
              if ((((local_8132 != 'X') && (local_8132 != 'F')) || (local_8131 != '(')) ||
                 (pcVar8 == (char *)0x0)) {
LAB_0010ad3b:
                in_ESI = (int)&local_8132;
                emit_fold_cold_2();
                goto LAB_0010ad4d;
              }
              *pcVar8 = '\0';
              if (funcidx != 0) {
                fwrite(",\n",2,1,(FILE *)ctx->fp);
              }
              pcVar8 = "  fold_%s";
              if (local_8132 == 'X') {
                pcVar8 = "  %s";
              }
              fprintf((FILE *)ctx->fp,pcVar8,local_8130);
              funcidx = funcidx + 1;
              pBVar15 = ctx;
            }
            else {
              *pcVar8 = '\0';
              local_8038[0] = &local_8131;
              uVar3 = nexttoken(local_8038,0,0);
              pBVar15 = (BuildCtx *)(ulong)uVar3;
              uVar4 = nexttoken(local_8038,0,0x7f);
              in_ESI = 1;
              uVar5 = nexttoken(local_8038,1,0x3ff);
              uVar2 = nkeys;
              uVar18 = funcidx;
              uVar9 = (ulong)nkeys;
              if (0xfff < uVar9) {
LAB_0010ad4d:
                emit_fold_cold_4();
                goto LAB_0010ad52;
              }
              pBVar15 = (BuildCtx *)(ulong)(uVar3 << 0x11);
              uVar17 = uVar4 << 10 | uVar3 << 0x11 | uVar5;
              if (uVar9 == 0) {
                uVar12 = 0;
              }
              else {
                uVar13 = uVar17 & 0xffffff;
                puVar14 = foldkeys + uVar9;
                do {
                  uVar12 = (uint)uVar9;
                  uVar16 = foldkeys[uVar12 - 1] & 0xffffff;
                  if (uVar16 < uVar13) goto LAB_0010ac0d;
                  if (uVar16 == uVar13) {
                    emit_fold_cold_3();
                    goto LAB_0010ad3b;
                  }
                  *puVar14 = foldkeys[uVar12 - 1];
                  puVar14 = puVar14 + -1;
                  uVar9 = uVar9 - 1;
                } while ((ulong)(uVar12 - 1) != 0);
                uVar12 = 0;
              }
LAB_0010ac0d:
              foldkeys[uVar12] = uVar17 | uVar18 << 0x18;
              nkeys = uVar2 + 1;
            }
          }
          pcVar7 = fgets((char *)unaff_RBP,0x100,__stream);
          pcVar8 = (char *)foldkeys;
        } while (pcVar7 != (char *)0x0);
      }
      fclose(__stream);
      fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
      uVar18 = nkeys;
      if (nkeys < 0x2000) {
        pcVar8 = "#define fold_hashkey(k)\t(lj_rol(lj_rol((k),%u)-(k),%u)%%%u)\n\n";
        uVar17 = nkeys | 1;
        do {
          unaff_RBP = (int *)0x0;
          do {
            iVar6 = tryhash((uint32_t *)local_8038,uVar17,(uint32_t)unaff_RBP,0);
            pBVar15 = (BuildCtx *)"#define fold_hashkey(k)\t(((((k)<<%u)-(k))<<%u)%%%u)\n\n";
            uVar18 = uVar17;
            if (iVar6 != 0) goto LAB_0010ace2;
            uVar12 = (uint32_t)unaff_RBP + 1;
            unaff_RBP = (int *)(ulong)uVar12;
          } while (uVar12 != 0x400);
          unaff_RBP = (int *)0x0;
          do {
            iVar6 = tryhash((uint32_t *)local_8038,uVar17,(uint32_t)unaff_RBP,1);
            pBVar15 = (BuildCtx *)pcVar8;
            if (iVar6 != 0) goto LAB_0010ace2;
            uVar12 = (uint32_t)unaff_RBP + 1;
            unaff_RBP = (int *)(ulong)uVar12;
          } while (uVar12 != 0x400);
          uVar18 = uVar17 + 2;
          bVar20 = uVar17 < 0x1ffe;
          uVar17 = uVar18;
        } while (bVar20);
      }
      emit_fold_cold_5();
      pBVar15 = (BuildCtx *)pcVar8;
LAB_0010ace2:
      printhash(ctx,(uint32_t *)local_8038,uVar18);
      fprintf((FILE *)ctx->fp,(char *)pBVar15,(ulong)unaff_RBP >> 5 & 0x7ffffff,
              (ulong)((uint)unaff_RBP & 0x1f),(ulong)uVar18);
      return;
    }
    in_ESI = 0x1115b5;
    __stream = fopen64((char *)pBVar15,"r");
    if (__stream != (FILE *)0x0) goto LAB_0010a9f0;
  }
  emit_fold_cold_1();
  __s = pBVar15->D;
  if (__s != (dasm_State *)0x0) {
    pcVar8 = strchr((char *)__s,0x20);
    if (pcVar8 == (char *)0x0) {
      pdVar11 = (dasm_State *)0x0;
    }
    else {
      pdVar11 = (dasm_State *)(pcVar8 + 1);
      *pcVar8 = '\0';
    }
    pBVar15->D = pdVar11;
    if (in_ESI != 0) {
      iVar6 = strncmp((char *)__s,"IRFPM_",6);
      if (iVar6 == 0) {
        pcVar8 = "FLOOR";
        uVar9 = 0;
        do {
          iVar6 = strcmp(pcVar8,(char *)((long)&__s->psize + 6));
          if (iVar6 == 0) {
            return;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          pcVar8 = irfpm_names[uVar9];
        } while (pcVar8 != (char *)0x0);
        goto LAB_0010af55;
      }
      iVar6 = strncmp((char *)__s,"IRFL_",5);
      if (iVar6 == 0) {
        pcVar8 = "STR_LEN";
        uVar9 = 0;
        do {
          iVar6 = strcmp(pcVar8,(char *)((long)&__s->psize + 5));
          if (iVar6 == 0) {
            return;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          pcVar8 = irfield_names[uVar9];
        } while (pcVar8 != (char *)0x0);
        goto LAB_0010af55;
      }
      iVar6 = strncmp((char *)__s,"IRCALL_",7);
      if (iVar6 == 0) {
        pcVar8 = "lj_str_cmp";
        uVar9 = 0;
        do {
          iVar6 = strcmp(pcVar8,(char *)((long)&__s->psize + 7));
          if (iVar6 == 0) {
            return;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          pcVar8 = ircall_names[uVar9];
        } while (pcVar8 != (char *)0x0);
        goto LAB_0010af55;
      }
      iVar6 = strncmp((char *)__s,"IRCONV_",7);
      if (iVar6 == 0) goto LAB_0010af5d;
      if ((byte)((char)__s->psize - 0x30U) < 10) {
        do {
          cVar1 = *(char *)((long)&__s->psize + 1);
          __s = (dasm_State *)((long)&__s->psize + 1);
        } while ((byte)(cVar1 - 0x30U) < 10);
        if (cVar1 == '\0') {
          return;
        }
        goto LAB_0010af55;
      }
    }
    if ((extraout_EDX == 0) || (iVar6 = strcmp("any",(char *)__s), iVar6 != 0)) {
      pcVar8 = "LT";
      uVar9 = 0;
      do {
        iVar6 = strcmp(pcVar8,(char *)__s);
        if (iVar6 == 0) {
          return;
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        pcVar8 = ir_names[uVar9];
      } while (pcVar8 != (char *)0x0);
LAB_0010af55:
      do {
        nexttoken_cold_1();
LAB_0010af5d:
        pcVar7 = "NIL";
        pcVar8 = (char *)((long)&__s->psize + 7);
        pcVar10 = strchr(pcVar8,0x5f);
        pcStack_8198 = "NIL";
        uVar9 = 0;
        do {
          if ((pcVar10 != (char *)0x0) &&
             (iVar6 = strncmp(pcVar7,pcVar8,(long)pcVar10 - (long)pcVar8), iVar6 == 0)) {
            uVar19 = 1;
            pcVar7 = pcStack_8198;
            do {
              iVar6 = strcmp(pcVar7,pcVar10 + 1);
              if (iVar6 == 0) {
                return;
              }
              pcVar7 = irt_names[uVar19];
              uVar19 = (ulong)((int)uVar19 + 1);
            } while (pcVar7 != (char *)0x0);
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          pcVar7 = irt_names[uVar9];
        } while (pcVar7 != (char *)0x0);
      } while( true );
    }
  }
  return;
}

Assistant:

void emit_fold(BuildCtx *ctx)
{
  char buf[256];  /* We don't care about analyzing lines longer than that. */
  const char *fname = ctx->args[0];
  FILE *fp;

  if (fname == NULL) {
    fprintf(stderr, "Error: missing input filename\n");
    exit(1);
  }

  if (fname[0] == '-' && fname[1] == '\0') {
    fp = stdin;
  } else {
    fp = fopen(fname, "r");
    if (!fp) {
      fprintf(stderr, "Error: cannot open input file '%s': %s\n",
	      fname, strerror(errno));
      exit(1);
    }
  }

  fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf(ctx->fp, "static const FoldFunc fold_func[] = {\n");

  lineno = 0;
  funcidx = 0;
  nkeys = 0;
  while (fgets(buf, sizeof(buf), fp) != NULL) {
    lineno++;
    /* The prefix must be at the start of a line, otherwise it's ignored. */
    if (!strncmp(buf, FOLDDEF_PREFIX, sizeof(FOLDDEF_PREFIX)-1)) {
      char *p = buf+sizeof(FOLDDEF_PREFIX)-1;
      char *q = strchr(p, ')');
      if (p[0] == '(' && q) {
	p++;
	*q = '\0';
	foldrule(p);
      } else if ((p[0] == 'F' || p[0] == 'X') && p[1] == '(' && q) {
	p += 2;
	*q = '\0';
	if (funcidx)
	  fprintf(ctx->fp, ",\n");
	if (p[-2] == 'X')
	  fprintf(ctx->fp, "  %s", p);
	else
	  fprintf(ctx->fp, "  fold_%s", p);
	funcidx++;
      } else {
	buf[strlen(buf)-1] = '\0';
	fprintf(stderr, "Error: unknown fold definition tag %s%s at line %d\n",
		FOLDDEF_PREFIX, p, lineno);
	exit(1);
      }
    }
  }
  fclose(fp);
  fprintf(ctx->fp, "\n};\n\n");

  makehash(ctx);
}